

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_enum_to_string_helper_function
          (t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  t_enum *ptVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_enum *local_20;
  t_enum *tenum_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_20 = tenum;
  tenum_local = (t_enum *)out;
  out_local = (ostream *)this;
  bVar2 = has_custom_ostream(this,&tenum->super_t_type);
  if (!bVar2) {
    std::operator<<((ostream *)tenum_local,"std::string to_string(const ");
    ptVar1 = tenum_local;
    if ((this->gen_pure_enums_ & 1U) == 0) {
      iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)CONCAT44(extraout_var_00,iVar3));
      std::operator<<(poVar4,"::type&");
    }
    else {
      iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator<<((ostream *)ptVar1,(string *)CONCAT44(extraout_var,iVar3));
    }
    std::operator<<((ostream *)tenum_local," val) ");
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tenum_local);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_40);
    poVar4 = std::operator<<(poVar4,"std::map<int, const char*>::const_iterator it = _");
    iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar4 = std::operator<<(poVar4,"_VALUES_TO_NAMES.find(val);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_40);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,"if (it != _");
    iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_02,iVar3));
    poVar4 = std::operator<<(poVar4,"_VALUES_TO_NAMES.end()) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,"return std::string(it->second);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4,"} else {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,"return std::to_string(static_cast<int>(val));");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tenum_local;
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tenum_local);
    std::operator<<((ostream *)tenum_local,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_enum_to_string_helper_function(std::ostream& out, t_enum* tenum) {
  if (!has_custom_ostream(tenum)) {
    out << "std::string to_string(const ";
    if (gen_pure_enums_) {
      out << tenum->get_name();
    } else {
      out << tenum->get_name() << "::type&";
    }
    out << " val) " ;
	scope_up(out);

    out << indent() << "std::map<int, const char*>::const_iterator it = _"
             << tenum->get_name() << "_VALUES_TO_NAMES.find(val);" << endl;
    out << indent() << "if (it != _" << tenum->get_name() << "_VALUES_TO_NAMES.end()) {" << endl;
    indent_up();
    out << indent() << "return std::string(it->second);" << endl;
    indent_down();
    out << indent() << "} else {" << endl;
    indent_up();
    out << indent() << "return std::to_string(static_cast<int>(val));" << endl;
    indent_down();
    out << indent() << "}" << endl;

    scope_down(out);
    out << endl;
  }
}